

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearStencil::initializeRbo
          (ModifyRenderbufferClearStencil *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl_00;
  glViewportFunc p_Var1;
  int iVar2;
  int iVar3;
  GLenum GVar4;
  deBool dVar5;
  PixelBufferAccess *access;
  Functions *gl;
  Texture2D *reference_local;
  GLuint renderbuffer_local;
  GLES2ImageApi *api_local;
  ModifyRenderbufferClearStencil *this_local;
  
  gl_00 = api->m_gl;
  framebufferRenderbuffer(gl_00,0x8d20,renderbuffer);
  do {
    p_Var1 = gl_00->viewport;
    iVar2 = tcu::Texture2D::getWidth(reference);
    iVar3 = tcu::Texture2D::getHeight(reference);
    (*p_Var1)(0,0,iVar2,iVar3);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x353);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl_00->clearStencil)(this->m_stencil);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"clearStencil(m_stencil)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x354);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl_00->clear)(0x400);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"clear(GL_STENCIL_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                    ,0x355);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  access = tcu::TextureLevelPyramid::getLevel(&reference->super_TextureLevelPyramid,0);
  tcu::clearStencil(access,this->m_stencil);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearStencil::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_STENCIL_ATTACHMENT, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearStencil(m_stencil));
	GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));

	tcu::clearStencil(reference.getLevel(0), m_stencil);
}